

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void do_control_channel_controllers_off(_mdi *mdi,_event_data *data)

{
  byte ch_00;
  uchar ch;
  _note *note_data;
  _event_data *data_local;
  _mdi *mdi_local;
  
  ch_00 = data->channel;
  mdi->channel[ch_00].expression = '\x7f';
  mdi->channel[ch_00].pressure = '\x7f';
  mdi->channel[ch_00].reg_data = 0xffff;
  mdi->channel[ch_00].pitch_range = 200;
  mdi->channel[ch_00].pitch = 0;
  mdi->channel[ch_00].pitch_adjust = 0;
  mdi->channel[ch_00].hold = '\0';
  _WM_AdjustChannelVolumes(mdi,ch_00);
  return;
}

Assistant:

static void do_control_channel_controllers_off(struct _mdi *mdi,
		struct _event_data *data) {
	struct _note *note_data = mdi->note;
	unsigned char ch = data->channel;

	mdi->channel[ch].expression = 127;
	mdi->channel[ch].pressure = 127;
	mdi->channel[ch].reg_data = 0xffff;
	mdi->channel[ch].pitch_range = 200;
	mdi->channel[ch].pitch = 0;
	mdi->channel[ch].pitch_adjust = 0;
	mdi->channel[ch].hold = 0;

	_WM_AdjustChannelVolumes(mdi, ch);
}